

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

int64_t av1_haar_ac_sad_mxn_uint8_input
                  (uint8_t *input,int stride,int hbd,int num_8x8_rows,int num_8x8_cols)

{
  int iVar1;
  int in_ECX;
  int in_R8D;
  int c8;
  int r8;
  int64_t wavelet_energy;
  int in_stack_000000d8;
  int in_stack_000000dc;
  uint8_t *in_stack_000000e0;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
      iVar1 = haar_ac_sad_8x8_uint8_input(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8);
      local_20 = iVar1 + local_20;
    }
  }
  return local_20;
}

Assistant:

int64_t av1_haar_ac_sad_mxn_uint8_input(const uint8_t *input, int stride,
                                        int hbd, int num_8x8_rows,
                                        int num_8x8_cols) {
  int64_t wavelet_energy = 0;
  for (int r8 = 0; r8 < num_8x8_rows; ++r8) {
    for (int c8 = 0; c8 < num_8x8_cols; ++c8) {
      wavelet_energy += haar_ac_sad_8x8_uint8_input(
          input + c8 * 8 + r8 * 8 * stride, stride, hbd);
    }
  }
  return wavelet_energy;
}